

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  MessageLite *this;
  LogMessage *other;
  UnknownFieldSet *unknown_fields;
  pair<int,_int> pVar3;
  Reflection *this_00;
  int byte_limit;
  LogMessage local_70;
  FieldDescriptor *local_38;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(this_00,message);
    bVar2 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar2;
  }
  if (*(int *)(field + 0x3c) != 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_70._0_8_ = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_70,
                 &local_38);
    }
    if (*(int *)(field + 0x38) == 0xb) {
      this = &Reflection::MutableMessage(this_00,message,field,input->extension_factory_)->
              super_MessageLite;
      puVar1 = input->buffer_;
      if ((puVar1 < input->buffer_end_) && (byte_limit = (int)(char)*puVar1, -1 < (char)*puVar1)) {
        input->buffer_ = puVar1 + 1;
        bVar2 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar2 = -1 < byte_limit;
      }
      if (!bVar2) {
        return false;
      }
      pVar3 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
      if ((long)pVar3 < 0) {
        return false;
      }
      bVar2 = MessageLite::MergePartialFromCodedStream(this,input);
      if (!bVar2) {
        return false;
      }
      bVar2 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar3.first);
      return bVar2;
    }
  }
  LogMessage::LogMessage
            (&local_70,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/wire_format.cc"
             ,0x196);
  other = LogMessage::operator<<(&local_70,"Extensions of MessageSets must be optional messages.");
  LogFinisher::operator=((LogFinisher *)&local_38,other);
  LogMessage::~LogMessage(&local_70);
  return false;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}